

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

cram_codec * cram_gamma_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  cram_codec *pcVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  pcVar2 = (cram_codec *)malloc(0x240);
  if (pcVar2 != (cram_codec *)0x0) {
    pcVar2->codec = E_GAMMA;
    pcVar2->decode = cram_gamma_decode;
    pcVar2->free = cram_gamma_decode_free;
    bVar1 = *data;
    uVar4 = (uint)bVar1;
    iVar5 = 1;
    if ((char)bVar1 < '\0') {
      uVar3 = (uint)bVar1;
      uVar4 = (uint)(byte)data[1];
      if (bVar1 < 0xc0) {
        uVar4 = (uVar3 & 0x3f) << 8 | uVar4;
        iVar5 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar4 = (uVar3 & 0x1f) << 0x10 | uVar4 << 8 | (uint)(byte)data[2];
        iVar5 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar4 = (uVar3 & 0xf) << 0x18 | uVar4 << 0x10 | (uint)(byte)data[2] << 8 |
                (uint)(byte)data[3];
        iVar5 = 4;
      }
      else {
        uVar4 = (byte)data[4] & 0xf |
                (uint)(byte)data[3] << 4 |
                (uint)(byte)data[2] << 0xc | uVar4 << 0x14 | uVar3 << 0x1c;
        iVar5 = 5;
      }
    }
    *(uint *)&pcVar2->field_6 = uVar4;
    if (iVar5 == size) {
      return pcVar2;
    }
    cram_gamma_decode_init_cold_1();
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_gamma_decode_init(char *data, int size,
				   enum cram_external_type option,
				   int version) {
    cram_codec *c;
    char *cp = data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_GAMMA;
    c->decode = cram_gamma_decode;
    c->free   = cram_gamma_decode_free;
    
    cp += itf8_get(cp, &c->gamma.offset);

    if (cp - data != size) {
	fprintf(stderr, "Malformed gamma header stream\n");
	free(c);
	return NULL;
    }

    return c;
}